

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeLodControlTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeLodControlTestInstance *this)

{
  TextureRenderer *this_00;
  deUint32 *this_01;
  TextureFormat TVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TestLog *pTVar6;
  int i;
  int iVar7;
  deUint32 width;
  deUint32 dVar8;
  uint uVar9;
  undefined4 extraout_var;
  TextureBinding *this_02;
  long lVar11;
  Surface *pSVar12;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  long lVar13;
  void *pvVar14;
  ulong uVar15;
  int local_4fc;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  undefined1 local_4d0 [40];
  undefined1 local_4a8 [44];
  deUint32 local_47c;
  undefined1 local_478 [48];
  vector<float,_std::allocator<float>_> texCoord;
  undefined1 local_420 [40];
  Surface referenceFrame;
  Surface renderedFrame;
  PixelFormat pixelFormat;
  Surface errorMask;
  LodPrecision lodPrec;
  LookupPrecision local_388;
  Random rnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  _Alloc_hider local_338;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_328 [4];
  ios_base local_2e0 [264];
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  IVec4 formatBitDepth;
  ReferenceParams refParams;
  PixelBufferAccess local_98;
  Sampler sampler;
  long lVar10;
  undefined4 extraout_var_00;
  
  iVar7 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
  lVar10 = CONCAT44(extraout_var,iVar7);
  this_00 = &this->m_renderer;
  width = util::TextureRenderer::getRenderWidth(this_00);
  dVar8 = util::TextureRenderer::getRenderHeight(this_00);
  util::createSampler(&sampler,CLAMP_TO_EDGE,CLAMP_TO_EDGE,this->m_minFilter,NEAREST);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            (&refParams,TEXTURETYPE_CUBE,&sampler,LODMODE_EXACT);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,width,dVar8);
  uVar2 = this->m_texSize;
  if (uVar2 == 0) {
    uVar9 = 0x20;
  }
  else {
    uVar9 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = uVar9 ^ 0x1f;
  }
  refParams.maxLevel = 0x1f - uVar9;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&rnd.m_rnd,7);
  randomPartition(&gridLayout,&rnd,0,0,width,dVar8);
  local_47c = dVar8;
  if (0 < (int)((ulong)((long)gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)gridLayout.
                             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    lVar13 = 0xc;
    uVar15 = 0;
    do {
      iVar7 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + -0xc);
      iVar3 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + -8);
      iVar4 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + -4);
      iVar5 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13);
      glu::TextureTestUtil::computeQuadTexCoordCube
                (&texCoord,(int)uVar15 + (int)((uVar15 & 0xffffffff) / 6) * -6);
      (*(this->super_TestInstance)._vptr_TestInstance[3])(this,&refParams,uVar15 & 0xffffffff);
      util::TextureRenderer::setViewport
                (this_00,(float)iVar7,(float)iVar3,(float)iVar4,(float)iVar5);
      this_02 = util::TextureRenderer::getTextureBinding(this_00,0);
      util::TextureBinding::updateTextureViewMipLevels
                (this_02,refParams.baseLevel,refParams.maxLevel);
      util::TextureRenderer::renderQuad
                (this_00,&renderedFrame,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&refParams);
      uVar15 = uVar15 + 1;
      lVar13 = lVar13 + 0x10;
    } while ((long)uVar15 <
             (long)(int)((ulong)((long)gridLayout.
                                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)gridLayout.
                                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4));
  }
  rnd.m_rnd._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)&rnd);
  dVar8 = local_47c;
  pixelFormat.redBits = formatBitDepth.m_data[0];
  pixelFormat.greenBits = formatBitDepth.m_data[1];
  pixelFormat.blueBits = formatBitDepth.m_data[2];
  pixelFormat.alphaBits = formatBitDepth.m_data[3];
  tcu::Surface::Surface(&referenceFrame,width,local_47c);
  tcu::Surface::Surface(&errorMask,width,dVar8);
  lVar13 = 0;
  do {
    local_388.coordBits.m_data[lVar13] = 0x16;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  lVar13 = 3;
  do {
    local_388.coordBits.m_data[lVar13] = 0x10;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 6);
  local_388.colorThreshold.m_data[0] = 0.0;
  local_388.colorThreshold.m_data[1] = 0.0;
  local_388.colorThreshold.m_data[2] = 0.0;
  local_388.colorThreshold.m_data[3] = 0.0;
  local_388.colorMask.m_data[0] = true;
  local_388.colorMask.m_data[1] = true;
  local_388.colorMask.m_data[2] = true;
  local_388.colorMask.m_data[3] = true;
  lodPrec.rule = RULE_VULKAN;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  util::createSampler((Sampler *)&rnd,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,NEAREST);
  refParams.sampler.magFilter = local_348._M_allocated_capacity._0_4_;
  refParams.sampler.lodThreshold = (float)local_348._M_allocated_capacity._4_4_;
  refParams.sampler.normalizedCoords = (bool)local_348._M_local_buf[8];
  refParams.sampler._25_3_ = local_348._9_3_;
  refParams.sampler.compare = local_348._12_4_;
  refParams.sampler.wrapS = rnd.m_rnd.x;
  refParams.sampler.wrapT = rnd.m_rnd.y;
  refParams.sampler.wrapR = rnd.m_rnd.z;
  refParams.sampler.minFilter = rnd.m_rnd.w;
  refParams.sampler._32_8_ = local_338._M_p;
  refParams.sampler.borderColor.v.uData[1] = uStack_330;
  refParams.sampler._53_7_ =
       SUB87(CONCAT44(aaStack_328[0]._8_4_,aaStack_328[0]._M_allocated_capacity._4_4_) >> 8,0);
  refParams.sampler.seamlessCubeMap = true;
  refParams.lodMode = LODMODE_EXACT;
  local_388.colorMask.m_data[1] = 0 < pixelFormat.greenBits;
  local_388.colorMask.m_data[0] = 0 < pixelFormat.redBits;
  local_388.colorMask.m_data[2] = 0 < pixelFormat.blueBits;
  local_388.colorMask.m_data[3] = 0 < pixelFormat.alphaBits;
  local_4d0._0_4_ = pixelFormat.redBits;
  local_4d0._4_4_ = pixelFormat.greenBits;
  local_4d0._8_4_ = pixelFormat.blueBits;
  local_4d0._12_4_ = pixelFormat.alphaBits;
  local_4a8._0_4_ = R;
  local_4a8._4_4_ = SNORM_INT8;
  local_4a8._8_8_ = 0;
  lVar13 = 0;
  do {
    *(int *)(local_4a8 + lVar13 * 4) = *(int *)(local_4d0 + lVar13 * 4) + -2;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  local_478._0_4_ = R;
  local_478._4_4_ = SNORM_INT8;
  local_478._8_8_ = 0;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar13 = 0;
  do {
    iVar7 = *(int *)(local_478 + lVar13 * 4);
    if (*(int *)(local_478 + lVar13 * 4) < *(int *)(local_4a8 + lVar13 * 4)) {
      iVar7 = *(int *)(local_4a8 + lVar13 * 4);
    }
    res.m_data[lVar13] = iVar7;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  tcu::computeFixedPointThreshold((tcu *)&rnd,&res);
  local_388.colorThreshold.m_data[0] = (float)rnd.m_rnd.x;
  local_388.colorThreshold.m_data[1] = (float)rnd.m_rnd.y;
  local_388.colorThreshold.m_data[2] = (float)rnd.m_rnd.z;
  local_388.colorThreshold.m_data[3] = (float)rnd.m_rnd.w;
  lVar13 = 0;
  do {
    (&rnd.m_rnd.x)[lVar13] = 10;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  local_388.coordBits.m_data[2] = rnd.m_rnd.z;
  local_388.coordBits.m_data[0] = rnd.m_rnd.x;
  local_388.coordBits.m_data[1] = rnd.m_rnd.y;
  local_388.uvwBits.m_data[0] = 5;
  local_388.uvwBits.m_data[1] = 5;
  local_388.uvwBits.m_data[2] = 0;
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = 6;
  if ((int)((ulong)((long)gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)gridLayout.
                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) < 1) {
    local_4fc = 0;
  }
  else {
    uVar15 = 0;
    lVar13 = 0xc;
    local_4fc = 0;
    do {
      iVar7 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + -0xc);
      iVar3 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + -8);
      iVar4 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + -4);
      iVar5 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13);
      glu::TextureTestUtil::computeQuadTexCoordCube
                (&texCoord,(int)uVar15 + (int)((uVar15 & 0xffffffff) / 6) * -6);
      (*(this->super_TestInstance)._vptr_TestInstance[3])(this,&refParams,uVar15 & 0xffffffff);
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)&res,&referenceFrame,&pixelFormat,iVar7,iVar3,iVar4,iVar5);
      aaStack_328[0]._M_allocated_capacity._0_4_ = (undefined4)*(undefined8 *)(lVar10 + 0x160);
      aaStack_328[0]._M_allocated_capacity._4_4_ =
           (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x160) >> 0x20);
      rnd.m_rnd._0_8_ = *(undefined8 *)(lVar10 + 0x130);
      rnd.m_rnd._8_8_ = *(undefined8 *)(lVar10 + 0x138);
      local_348._M_allocated_capacity = *(undefined8 *)(lVar10 + 0x140);
      local_348._8_8_ = *(undefined8 *)(lVar10 + 0x148);
      local_338._M_p = *(pointer *)(lVar10 + 0x150);
      uStack_330 = (undefined4)*(undefined8 *)(lVar10 + 0x158);
      uStack_32c = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x158) >> 0x20);
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)&res,(TextureCubeView *)&rnd,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&refParams);
      rnd.m_rnd.x = 8;
      rnd.m_rnd.y = 3;
      pvVar14 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar14 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_4a8,(TextureFormat *)&rnd,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar14);
      tcu::getSubregion((PixelBufferAccess *)&res,(PixelBufferAccess *)local_4a8,iVar7,iVar3,iVar4,
                        iVar5);
      rnd.m_rnd.x = 8;
      rnd.m_rnd.y = 3;
      pvVar14 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar14 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_478,(TextureFormat *)&rnd,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar14);
      tcu::getSubregion((PixelBufferAccess *)local_4d0,(PixelBufferAccess *)local_478,iVar7,iVar3,
                        iVar4,iVar5);
      rnd.m_rnd.x = 8;
      rnd.m_rnd.y = 3;
      pvVar14 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar14 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_98,(TextureFormat *)&rnd,errorMask.m_width,errorMask.m_height,1,pvVar14);
      tcu::getSubregion((PixelBufferAccess *)local_420,&local_98,iVar7,iVar3,iVar4,iVar5);
      iVar7 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
      lVar11 = CONCAT44(extraout_var_00,iVar7);
      aaStack_328[0]._M_allocated_capacity._0_4_ = (undefined4)*(undefined8 *)(lVar11 + 0x160);
      aaStack_328[0]._M_allocated_capacity._4_4_ =
           (undefined4)((ulong)*(undefined8 *)(lVar11 + 0x160) >> 0x20);
      rnd.m_rnd._0_8_ = *(undefined8 *)(lVar11 + 0x130);
      rnd.m_rnd._8_8_ = *(undefined8 *)(lVar11 + 0x138);
      local_348._M_allocated_capacity = *(long *)(lVar11 + 0x140);
      local_348._8_8_ = *(undefined8 *)(lVar11 + 0x148);
      local_338._M_p = *(pointer *)(lVar11 + 0x150);
      uStack_330 = (undefined4)*(undefined8 *)(lVar11 + 0x158);
      uStack_32c = (undefined4)((ulong)*(undefined8 *)(lVar11 + 0x158) >> 0x20);
      iVar7 = glu::TextureTestUtil::computeTextureLookupDiff
                        ((ConstPixelBufferAccess *)&res,(ConstPixelBufferAccess *)local_4d0,
                         (PixelBufferAccess *)local_420,(TextureCubeView *)&rnd,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,&refParams,&local_388,&lodPrec,
                         ((this->super_TestInstance).m_context)->m_testCtx->m_watchDog);
      local_4fc = local_4fc + iVar7;
      uVar15 = uVar15 + 1;
      lVar13 = lVar13 + 0x10;
    } while ((long)uVar15 <
             (long)(int)((ulong)((long)gridLayout.
                                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)gridLayout.
                                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4));
  }
  if (0 < local_4fc) {
    rnd.m_rnd._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    this_01 = &rnd.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"ERROR: Image verification failed, found ",0x28);
    std::ostream::operator<<(this_01,local_4fc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," invalid pixels!",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
    std::ios_base::~ios_base(local_2e0);
  }
  pTVar6 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_4a8._0_8_ = (long)local_4a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"Result","");
  local_4d0._0_8_ = (long)local_4d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&res,(string *)local_4a8,(string *)local_4d0);
  tcu::TestLog::startImageSet(pTVar6,(char *)res.m_data._0_8_,local_1b8._M_p);
  local_478._0_8_ = (long)local_478 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"Rendered","");
  TVar1 = (TextureFormat)((long)local_420 + 0x10);
  local_420._0_8_ = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"Rendered image","");
  pSVar12 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)&rnd,(string *)local_478,(string *)local_420,pSVar12,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&rnd,(int)pTVar6,__buf,(size_t)pSVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_p != aaStack_328) {
    operator_delete(local_338._M_p,
                    CONCAT44(aaStack_328[0]._M_allocated_capacity._4_4_,
                             (undefined4)aaStack_328[0]._M_allocated_capacity) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rnd.m_rnd._0_8_ != &local_348) {
    operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_348._M_allocated_capacity + 1));
  }
  if ((TextureFormat)local_420._0_8_ != TVar1) {
    operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
  }
  if (local_478._0_8_ != (long)local_478 + 0x10) {
    operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._0_8_ != &local_1c8) {
    operator_delete((void *)res.m_data._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  if (local_4d0._0_8_ != (long)local_4d0 + 0x10) {
    operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
  }
  if (local_4a8._0_8_ != (long)local_4a8 + 0x10) {
    operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
  }
  if (0 < local_4fc) {
    pTVar6 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    local_4a8._0_8_ = (long)local_4a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"Reference","");
    local_4d0._0_8_ = (long)local_4d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Ideal reference","");
    pSVar12 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)&rnd,(string *)local_4a8,(string *)local_4d0,pSVar12,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar7 = (int)pTVar6;
    tcu::LogImage::write((LogImage *)&rnd,iVar7,__buf_00,(size_t)pSVar12);
    local_478._0_8_ = (long)local_478 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"ErrorMask","");
    local_420._0_8_ = TVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"Error mask","");
    pSVar12 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&res,(string *)local_478,(string *)local_420,pSVar12,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&res,iVar7,__buf_01,(size_t)pSVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_p != local_1a8) {
      operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res.m_data._0_8_ != &local_1c8) {
      operator_delete((void *)res.m_data._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_420._0_8_ != TVar1) {
      operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
    }
    if (local_478._0_8_ != (long)local_478 + 0x10) {
      operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_p != aaStack_328) {
      operator_delete(local_338._M_p,
                      CONCAT44(aaStack_328[0]._M_allocated_capacity._4_4_,
                               (undefined4)aaStack_328[0]._M_allocated_capacity) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rnd.m_rnd._0_8_ != &local_348) {
      operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_348._M_allocated_capacity + 1));
    }
    if (local_4d0._0_8_ != (long)local_4d0 + 0x10) {
      operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
    }
    if (local_4a8._0_8_ != (long)local_4a8 + 0x10) {
      operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
    }
  }
  tcu::TestLog::endImageSet(((this->super_TestInstance).m_context)->m_testCtx->m_log);
  rnd.m_rnd._0_8_ = &local_348;
  if (local_4fc == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&rnd,"pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,rnd.m_rnd._0_8_,
               rnd.m_rnd._8_8_ + rnd.m_rnd._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&rnd,"fail","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,rnd.m_rnd._0_8_,
               rnd.m_rnd._8_8_ + rnd.m_rnd._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rnd.m_rnd._0_8_ != &local_348) {
    operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_348._M_allocated_capacity + 1));
  }
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  if (gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(gridLayout.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&renderedFrame);
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TextureCubeLodControlTestInstance::iterate (void)
{
	const tcu::Sampler::WrapMode	wrapS			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::WrapMode	wrapT			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::FilterMode	magFilter		= Sampler::NEAREST;

	const tcu::TextureCube&			refTexture		= m_texture->getTexture();
	const int						viewportWidth	= m_renderer.getRenderWidth();
	const int						viewportHeight	= m_renderer.getRenderHeight();

	tcu::Sampler					sampler			= util::createSampler(wrapS, wrapT, m_minFilter, magFilter);
	ReferenceParams					refParams		(TEXTURETYPE_CUBE, sampler);
	vector<float>					texCoord;
	tcu::Surface					renderedFrame	(viewportWidth, viewportHeight);

	refParams.maxLevel = deLog2Floor32(m_texSize);

	// Compute grid.
	vector<tcu::IVec4> gridLayout;
	computeGridLayout(gridLayout, viewportWidth, viewportHeight);

	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		const int			curX		= gridLayout[cellNdx].x();
		const int			curY		= gridLayout[cellNdx].y();
		const int			curW		= gridLayout[cellNdx].z();
		const int			curH		= gridLayout[cellNdx].w();
		const tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

		computeQuadTexCoordCube(texCoord, cubeFace);
		getReferenceParams(refParams, cellNdx);

		// Render with GL.
		m_renderer.setViewport((float)curX, (float)curY, (float)curW, (float)curH);
		m_renderer.getTextureBinding(0)->updateTextureViewMipLevels(refParams.baseLevel, refParams.maxLevel);
		m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
	}

	// Render reference and compare
	{
		const tcu::IVec4		formatBitDepth		= getTextureFormatBitDepth(mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat			(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		tcu::Surface			referenceFrame		(viewportWidth, viewportHeight);
		tcu::Surface			errorMask			(viewportWidth, viewportHeight);
		int						numFailedPixels		= 0;
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec				(tcu::LodPrecision::RULE_VULKAN);

		// Params for rendering reference
		refParams.sampler					= util::createSampler(wrapS, wrapT, m_testParameters.minFilter, magFilter);
		refParams.sampler.seamlessCubeMap	= true;
		refParams.lodMode					= LODMODE_EXACT;

		// Comparison parameters
		lookupPrec.colorMask				= getCompareMask(pixelFormat);
		lookupPrec.colorThreshold			= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat)-2, IVec4(0)));
		lookupPrec.coordBits				= tcu::IVec3(10);
		lookupPrec.uvwBits					= tcu::IVec3(5,5,0);
		lodPrec.derivateBits				= 10;
		lodPrec.lodBits						= 6;

		for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
		{
			const int				curX		= gridLayout[cellNdx].x();
			const int				curY		= gridLayout[cellNdx].y();
			const int				curW		= gridLayout[cellNdx].z();
			const int				curH		= gridLayout[cellNdx].w();
			const tcu::CubeFace		cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

			computeQuadTexCoordCube(texCoord, cubeFace);
			getReferenceParams(refParams, cellNdx);

			// Render ideal reference.
			{
				tcu::SurfaceAccess idealDst(referenceFrame, pixelFormat, curX, curY, curW, curH);
				sampleTexture(idealDst, refTexture, &texCoord[0], refParams);
			}

			// Compare this cell
			numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
														m_texture->getTexture(), &texCoord[0], refParams,
														lookupPrec, lodPrec,  m_context.getTestContext().getWatchDog());
		}

		if (numFailedPixels > 0)
			 m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		 m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											 << TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			 m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												 << TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		 m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}